

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockSingleStructArrayCase::init
          (BlockSingleStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  BlockSingleStructArrayCase *extraout_RAX;
  VarType local_1b0;
  BufferVar local_198;
  VarType local_158;
  VarType local_140;
  BufferVar local_128;
  VarType local_e8;
  BufferVar local_d0;
  BufferBlock *local_90;
  BufferBlock *block;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockSingleStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType(&local_70,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_58,&local_70,4);
  glu::StructType::addMember(pSVar1,"b",&local_58);
  glu::VarType::~VarType(&local_58);
  glu::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_90 = pBVar2;
  glu::VarType::VarType(&local_e8,TYPE_UINT,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_d0,"u",&local_e8,0);
  bb::BufferBlock::addMember(pBVar2,&local_d0);
  bb::BufferVar::~BufferVar(&local_d0);
  glu::VarType::~VarType(&local_e8);
  pBVar2 = local_90;
  glu::VarType::VarType(&local_158,local_18);
  glu::VarType::VarType(&local_140,&local_158,3);
  bb::BufferVar::BufferVar(&local_128,"s",&local_140,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_128);
  bb::BufferVar::~BufferVar(&local_128);
  glu::VarType::~VarType(&local_140);
  glu::VarType::~VarType(&local_158);
  pBVar2 = local_90;
  glu::VarType::VarType(&local_1b0,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_198,"v",&local_1b0,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_198);
  bb::BufferVar::~BufferVar(&local_198);
  glu::VarType::~VarType(&local_1b0);
  bb::BufferBlock::setFlags(local_90,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setInstanceName(local_90,"block");
    bb::BufferBlock::setArraySize(local_90,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), 3), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}